

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O0

TrieNode<unsigned_char> * pseudo_sample<unsigned_char>(uchar **strings,size_t n)

{
  bool bVar1;
  ostream *poVar2;
  TrieNode<unsigned_char> *pTVar3;
  reference ppvVar4;
  reference local_80;
  undefined1 local_70 [31];
  uchar c;
  TrieNode<unsigned_char> *node;
  size_t depth;
  uchar *str;
  size_t i;
  TrieNode<unsigned_char> *local_28;
  TrieNode<unsigned_char> *root;
  size_t max_nodes;
  size_t n_local;
  uchar **strings_local;
  
  max_nodes = n;
  n_local = (size_t)strings;
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"pseudo_sample");
  poVar2 = std::operator<<(poVar2,"(): sampling ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,max_nodes >> 0xd);
  std::operator<<(poVar2," strings ...\n");
  root = (TrieNode<unsigned_char> *)0x3857;
  pTVar3 = (TrieNode<unsigned_char> *)operator_new(0x820);
  TrieNode<unsigned_char>::TrieNode(pTVar3);
  local_28 = pTVar3;
  for (str = (uchar *)0x0; str < max_nodes; str = str + 0x2000) {
    depth = *(size_t *)(n_local + (long)str * 8);
    node = (TrieNode<unsigned_char> *)0x0;
    stack0xffffffffffffffa8 = local_28;
    while( true ) {
      local_70[0x17] = get_char<unsigned_char>((uchar *)depth,(size_t)node);
      bVar1 = is_end<unsigned_char>(local_70[0x17]);
      if (bVar1) break;
      node = (TrieNode<unsigned_char> *)((long)(node->buckets)._M_elems + 1);
      std::bitset<256UL>::operator[]
                ((bitset<256UL> *)local_70,(size_t)&stack0xffffffffffffffa8->is_trie);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_70);
      std::bitset<256UL>::reference::~reference((reference *)local_70);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::bitset<256UL>::operator[]
                  ((bitset<256UL> *)&local_80,(size_t)&stack0xffffffffffffffa8->is_trie);
        std::bitset<256UL>::reference::operator=(&local_80,true);
        std::bitset<256UL>::reference::~reference(&local_80);
        pTVar3 = (TrieNode<unsigned_char> *)operator_new(0x820);
        TrieNode<unsigned_char>::TrieNode(pTVar3);
        ppvVar4 = std::array<void_*,_256UL>::operator[]
                            (&stack0xffffffffffffffa8->buckets,(ulong)local_70[0x17]);
        *ppvVar4 = pTVar3;
        root = (TrieNode<unsigned_char> *)
               ((long)root[-1].is_trie.super__Base_bitset<4UL>._M_w + 0x1f);
        if (root == (TrieNode<unsigned_char> *)0x0) goto LAB_002bd5b3;
      }
      ppvVar4 = std::array<void_*,_256UL>::operator[]
                          (&stack0xffffffffffffffa8->buckets,(ulong)local_70[0x17]);
      unique0x00012000 = (TrieNode<unsigned_char> *)*ppvVar4;
      if (unique0x00012000 == (TrieNode<unsigned_char> *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                      ,0xcb,
                      "TrieNode<CharT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char]"
                     );
      }
    }
  }
LAB_002bd5b3:
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"   Sampling done, created ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3857 - (long)root);
  std::operator<<(poVar2," nodes.\n");
  return local_28;
}

Assistant:

static TrieNode<CharT>*
pseudo_sample(unsigned char** strings, size_t n)
{
	// Limit the maximum number of nodes to whatever fits in 30 megabytes.
	debug()<<__func__<<"(): sampling "<<n/8192<<" strings ...\n";
	size_t max_nodes = 30000000/sizeof(TrieNode<CharT>);
	TrieNode<CharT>* root = new TrieNode<CharT>;
	for (size_t i=0; i < n; i += 8192) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		TrieNode<CharT>* node = root;
		while (true) {
			CharT c = get_char<CharT>(str, depth);
			if (is_end(c)) break;
			depth += sizeof(CharT);
			if (not node->is_trie[c]) {
				node->is_trie[c] = true;
				node->buckets[c] = new TrieNode<CharT>;
				if (--max_nodes==0) goto finish;
			}
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			assert(node);
		}
	}
finish:
	debug()<<"   Sampling done, created "
	       <<(30000000/sizeof(TrieNode<CharT>))-max_nodes<<" nodes.\n";
	return root;
}